

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::Mine::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Mine *this)

{
  byte *pbVar1;
  _Base_ptr p_Var2;
  KBOOL KVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  KCHAR8 Tab;
  undefined8 in_RCX;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  byte *pbVar8;
  KString KStack_208;
  KString local_1e8;
  KString *local_1c8;
  _Rb_tree_node_base *local_1c0;
  KStringStream ss;
  ostream local_1a8 [376];
  
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<(local_1a8,"Mine:");
  poVar4 = std::operator<<(poVar4,"\n\tLocation: ");
  Vector::GetAsString_abi_cxx11_(&KStack_208,&this->m_Loc);
  poVar4 = std::operator<<(poVar4,(string *)&KStack_208);
  poVar4 = std::operator<<(poVar4,"\n\tID: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_ui16ID);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&KStack_208);
  KVar3 = MinefieldDataFilter::IsGroundBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar3) {
    poVar4 = std::operator<<(local_1a8,"\tGround Burial Offset: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)this->m_f32GrndOffset);
    std::operator<<(poVar4,"\n");
  }
  KVar3 = MinefieldDataFilter::IsWaterBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar3) {
    poVar4 = std::operator<<(local_1a8,"\tWater Burial Offset: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)this->m_f32WtrOffset);
    std::operator<<(poVar4,"\n");
  }
  KVar3 = MinefieldDataFilter::IsSnowBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar3) {
    poVar4 = std::operator<<(local_1a8,"\tSnow Burial Offset: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)this->m_f32SnwOffset);
    std::operator<<(poVar4,"\n");
  }
  KVar3 = MinefieldDataFilter::IsMineOrientation(&this->super_MinefieldDataFilter);
  if (KVar3) {
    poVar4 = std::operator<<(local_1a8,"\tOrientation: ");
    EulerAngles::GetAsString_abi_cxx11_(&KStack_208,&this->m_Ori);
    std::operator<<(poVar4,(string *)&KStack_208);
    std::__cxx11::string::~string((string *)&KStack_208);
  }
  KVar3 = MinefieldDataFilter::IsThermalContrast(&this->super_MinefieldDataFilter);
  if (KVar3) {
    poVar4 = std::operator<<(local_1a8,"\tThermal Contrast: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)this->m_f32ThrmCont);
    std::operator<<(poVar4,"\n");
  }
  KVar3 = MinefieldDataFilter::IsReflectance(&this->super_MinefieldDataFilter);
  if (KVar3) {
    poVar4 = std::operator<<(local_1a8,"\tReflectance: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)this->m_f32Rflt);
    std::operator<<(poVar4,"\n");
  }
  KVar3 = MinefieldDataFilter::IsMineEmplacementAge(&this->super_MinefieldDataFilter);
  if (KVar3) {
    poVar4 = std::operator<<(local_1a8,"\tMine Emplacement Age:\n");
    ClockTime::GetAsString_abi_cxx11_(&local_1e8,&this->m_MET);
    UTILS::IndentString(&KStack_208,&local_1e8,2,(KCHAR8)in_RCX);
    std::operator<<(poVar4,(string *)&KStack_208);
    std::__cxx11::string::~string((string *)&KStack_208);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  KVar3 = MinefieldDataFilter::IsFusing(&this->super_MinefieldDataFilter);
  if (KVar3) {
    MineFusing::GetAsString_abi_cxx11_(&local_1e8,&this->m_MF);
    UTILS::IndentString(&KStack_208,&local_1e8,1,(KCHAR8)in_RCX);
    std::operator<<(local_1a8,(string *)&KStack_208);
    std::__cxx11::string::~string((string *)&KStack_208);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  KVar3 = MinefieldDataFilter::IsScalarDetectionCoefficient(&this->super_MinefieldDataFilter);
  Tab = (KCHAR8)in_RCX;
  if (KVar3) {
    std::operator<<(local_1a8,"\tScalar Detection Coefficients:\n");
    pbVar1 = (this->m_vui8SDC).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pbVar8 = (this->m_vui8SDC).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start; Tab = (KCHAR8)in_RCX, pbVar8 != pbVar1;
        pbVar8 = pbVar8 + 1) {
      poVar4 = std::operator<<(local_1a8,"\t\t");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ushort)*pbVar8);
      std::operator<<(poVar4,"\n");
    }
  }
  KVar3 = MinefieldDataFilter::IsPaintScheme(&this->super_MinefieldDataFilter);
  if (KVar3) {
    MinePaintScheme::GetAsString_abi_cxx11_(&local_1e8,&this->m_MPS);
    UTILS::IndentString(&KStack_208,&local_1e8,1,Tab);
    std::operator<<(local_1a8,(string *)&KStack_208);
    std::__cxx11::string::~string((string *)&KStack_208);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  KVar3 = MinefieldDataFilter::IsTripDetonationWire(&this->super_MinefieldDataFilter);
  if (KVar3) {
    poVar4 = std::operator<<(local_1a8,"\tNumber Trip/Det Wires: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ushort)this->m_ui8NumTrpDetWrs);
    std::operator<<(poVar4,"\n");
    local_1c0 = &(this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header;
    for (p_Var5 = (this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var5 != local_1c0; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      poVar4 = std::operator<<(local_1a8,"\tNumber Of Vertices: ");
      uVar6 = 0x18;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"\n");
      p_Var2 = p_Var5[1]._M_left;
      for (p_Var7 = p_Var5[1]._M_parent; p_Var7 != p_Var2; p_Var7 = (_Base_ptr)&p_Var7->_M_right) {
        (**(code **)(*(long *)p_Var7 + 0x10))(&local_1e8,p_Var7);
        UTILS::IndentString(&KStack_208,&local_1e8,2,(KCHAR8)uVar6);
        std::operator<<(local_1a8,(string *)&KStack_208);
        std::__cxx11::string::~string((string *)&KStack_208);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return local_1c8;
}

Assistant:

KString Mine::GetAsString() const
{
    KStringStream ss;

    ss << "Mine:"
       << "\n\tLocation: " << m_Loc.GetAsString()
       << "\n\tID: "       << m_ui16ID
       << "\n";

    if( IsGroundBurialDepthOffset() )
    {
        ss << "\tGround Burial Offset: " << m_f32GrndOffset << "\n";
    }

    if( IsWaterBurialDepthOffset() )
    {
        ss << "\tWater Burial Offset: " << m_f32WtrOffset << "\n";
    }

    if( IsSnowBurialDepthOffset() )
    {
        ss << "\tSnow Burial Offset: " << m_f32SnwOffset << "\n";
    }

    if( IsMineOrientation() )
    {
        ss << "\tOrientation: " << m_Ori.GetAsString();
    }

    if( IsThermalContrast() )
    {
        ss << "\tThermal Contrast: " << m_f32ThrmCont << "\n";
    }

    if( IsReflectance() )
    {
        ss << "\tReflectance: " << m_f32Rflt << "\n";
    }

    if( IsMineEmplacementAge() )
    {
        ss << "\tMine Emplacement Age:\n" << IndentString( m_MET.GetAsString(), 2 );
    }

    if( IsFusing() )
    {
        ss << IndentString( m_MF.GetAsString(), 1 );
    }

    if( IsScalarDetectionCoefficient() )
    {
        ss << "\tScalar Detection Coefficients:\n";
        vector<KUINT8>::const_iterator citr = m_vui8SDC.begin();
        vector<KUINT8>::const_iterator citrEnd = m_vui8SDC.end();
        for( ; citr != citrEnd; ++citr )
        {
            ss << "\t\t" << ( KUINT16 )*citr << "\n";
        }
    }

    if( IsPaintScheme() )
    {
        ss << IndentString( m_MPS.GetAsString(), 1 );
    }

    if( IsTripDetonationWire() )
    {
        ss << "\tNumber Trip/Det Wires: " << ( KUINT16 )m_ui8NumTrpDetWrs << "\n";

        map< KUINT16, vector<Vector> >::const_iterator citrM = m_mvVertices.begin();
        map< KUINT16, vector<Vector> >::const_iterator citrMEnd = m_mvVertices.end();
        for( ; citrM != citrMEnd; ++citrM )
        {
            ss << "\tNumber Of Vertices: " << citrM->second.size() << "\n";

            vector<Vector>::const_iterator citrV = citrM->second.begin();
            vector<Vector>::const_iterator citrVEnd = citrM->second.end();
            for( ; citrV != citrVEnd; ++citrV )
            {
                ss << IndentString( citrV->GetAsString(), 2 );
            }
        }
    }

    return ss.str();
}